

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Texture2DGradientTestCase
          (Texture2DGradientTestCase *this,TestContext *testCtx,char *name,char *desc,
          TextureFormat format,IVec3 *dimensions,VkFilter magFilter,VkFilter minFilter,
          VkSamplerMipmapMode mipmapFilter,VkSamplerAddressMode wrappingMode,bool useDerivatives)

{
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  LookupLodMode LVar4;
  pointer pCVar5;
  pointer pCVar6;
  TestCaseData *pTVar7;
  string *this_01;
  ShaderSpec *this_02;
  int i;
  VkFormat VVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  string result;
  string local_238;
  VarType local_218;
  long lStack_200;
  VkFilter local_1f4;
  string *local_1f0;
  string *local_1e8;
  TestCaseData *local_1e0;
  IVec3 *local_1d8;
  ShaderSpec *local_1d0;
  Symbol local_1c8 [2];
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  local_1f4 = (VkFilter)dimensions;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,name,(allocator<char> *)&local_218);
  paVar1 = &local_238.field_2;
  local_238.field_2._M_allocated_capacity._0_4_ = 0x2e2e2e;
  local_238._M_string_length = 3;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,local_1c8[0].name._M_dataplus._M_p,paVar1->_M_local_buf);
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TestCase_00cec1f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != &local_1c8[0].name.field_2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  lVar10 = 0;
  (this->super_TextureFilteringTestCase).m_executor.
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = (ShaderExecutor *)0x0;
  local_1e0 = &(this->super_TextureFilteringTestCase).m_testCaseData;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_testCaseData.pba.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = &(this->super_TextureFilteringTestCase).m_testCaseData.imParams.size;
  pTVar7 = &(this->super_TextureFilteringTestCase).m_testCaseData;
  (pTVar7->imParams).size.m_data[0] = 0;
  (pTVar7->imParams).size.m_data[1] = 0;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.size.m_data[2] = 0;
  local_1d0 = &(this->super_TextureFilteringTestCase).m_shaderSpec;
  local_1f0 = (string *)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.inputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.outputs.
  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2._M_local_buf[0] =
       '\0';
  local_1e8 = (string *)&(this->super_TextureFilteringTestCase).m_shaderSpec.source;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_dataplus._M_p =
       (pointer)&(this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_string_length = 0;
  (this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2._M_local_buf[0] = '\0';
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TextureFilteringTestCase_00d02a80;
  this->m_format = (TextureFormat)desc;
  do {
    (this->m_dimensions).m_data[lVar10] = *(int *)((long)format + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  this->m_magFilter = local_1f4;
  this->m_minFilter = magFilter;
  this->m_mipmapFilter = minFilter;
  this->m_wrappingMode = mipmapFilter;
  this->m_useDerivatives = (bool)(undefined1)wrappingMode;
  uVar9 = (this->m_dimensions).m_data[0];
  uVar3 = (this->m_dimensions).m_data[1];
  VVar8 = ::vk::mapTextureFormat(&this->m_format);
  if ((int)uVar3 < (int)uVar9) {
    uVar3 = uVar9;
  }
  uVar9 = 0x20;
  if (uVar3 != 0) {
    uVar9 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  uVar14 = (ulong)VVar8 << 0x20 | 2;
  local_1c8[0].name._M_string_length =
       CONCAT44(local_1c8[0].name._M_string_length._4_4_,(this->m_dimensions).m_data[2]);
  local_1c8[0].name._M_dataplus._M_p = *(pointer *)(this->m_dimensions).m_data;
  pCVar5 = (this->super_TextureFilteringTestCase).m_testCaseData.pba.
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar6 = (this->super_TextureFilteringTestCase).m_testCaseData.pba.
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_1e0->pba).
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_1e0->pba).
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_1e0->pba).
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pCVar5 != (pointer)0x0) {
    operator_delete(pCVar5,(long)pCVar6 - (long)pCVar5);
  }
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.dim = (int)uVar14;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.format = (int)(uVar14 >> 0x20);
  local_1d8->m_data[2] = (int)local_1c8[0].name._M_string_length;
  *(pointer *)local_1d8->m_data = local_1c8[0].name._M_dataplus._M_p;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.levels = 0x20 - uVar9;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed = false;
  (this->super_TextureFilteringTestCase).m_testCaseData.imParams.arrayLayers = 1;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.magFilter = local_1f4;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.minFilter = magFilter;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.mipmapFilter = minFilter;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.wrappingModeU = mipmapFilter;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.wrappingModeV = mipmapFilter;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.wrappingModeW = mipmapFilter;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.borderColor =
       VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.lodBias = 0.0;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.minLod = -1.0;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.maxLod = 50.0;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isUnnormalized = false;
  (this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare = false;
  (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode =
       (uint)(byte)((undefined1)wrappingMode ^ VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT);
  (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.hasLodBias = false;
  (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.isProjective = false;
  (this->super_TextureFilteringTestCase).m_testCaseData.shaderType = SHADERTYPE_FRAGMENT;
  paVar2 = &local_1c8[0].name.field_2;
  local_1c8[0].name.field_2._M_allocated_capacity._0_4_ = 0x636576;
  local_1c8[0].name._M_string_length = 3;
  local_1c8[0].name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::push_back((char)local_1c8);
  this_02 = local_1d0;
  paVar1 = &local_238.field_2;
  std::__cxx11::string::append((char *)local_1c8);
  std::__cxx11::string::push_back((char)local_1c8);
  std::__cxx11::string::append((char *)local_1c8);
  this_01 = local_1e8;
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)local_1c8);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true) {
    std::__cxx11::string::append((char *)local_1c8);
  }
  std::__cxx11::string::append((char *)local_1c8);
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::append((char *)&local_238);
  if ((this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.isProjective ==
      true) {
    std::__cxx11::string::append((char *)&local_238);
  }
  LVar4 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if ((LVar4 == LOOKUP_LOD_MODE_DERIVATIVES) || (LVar4 == LOOKUP_LOD_MODE_LOD)) {
    std::__cxx11::string::append((char *)&local_238);
  }
  std::__cxx11::string::append((char *)&local_238);
  std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1c8[0].name._M_dataplus._M_p);
  LVar4 = (this->super_TextureFilteringTestCase).m_testCaseData.sampleLookupSettings.lookupLodMode;
  if (LVar4 != LOOKUP_LOD_MODE_LOD) {
    if (LVar4 != LOOKUP_LOD_MODE_DERIVATIVES) goto LAB_007d4ab1;
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::push_back((char)&local_238);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::push_back((char)&local_238);
  }
  std::__cxx11::string::append((char *)&local_238);
LAB_007d4ab1:
  std::__cxx11::string::append((char *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  std::__cxx11::string::operator=(this_01,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this_01);
  local_238._M_string_length = 6;
  local_238.field_2._M_allocated_capacity._0_7_ = 0x746c75736572;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  this_00 = &(this->super_TextureFilteringTestCase).m_shaderSpec.outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_00,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity = 0x4364656c706d6173;
  local_238._M_string_length = 0xc;
  local_238.field_2._8_5_ = 0x64726f6f;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_00,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_6_ = 0x64726f6f63;
  local_238._M_string_length = 5;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_6_ = 0x726579616c;
  local_238._M_string_length = 5;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x66655264;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x78645064;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_string_length = 4;
  local_238.field_2._M_allocated_capacity._0_5_ = 0x79645064;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238.field_2._M_allocated_capacity._0_4_ = 0x646f6c;
  local_238._M_string_length = 3;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  glu::VarType::VarType(&local_218,TYPE_FLOAT,PRECISION_HIGHP);
  shaderexecutor::Symbol::Symbol(local_1c8,&local_238,&local_218);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_02->inputs,local_1c8);
  glu::VarType::~VarType(&local_1c8[0].varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  glu::VarType::~VarType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0xb2776f);
  plVar12 = plVar11 + 2;
  if ((long *)*plVar11 == plVar12) {
    local_218.m_data._8_8_ = *plVar12;
    lStack_200 = plVar11[3];
    local_218._0_8_ = (long)&local_218 + 0x10U;
  }
  else {
    local_218.m_data._8_8_ = *plVar12;
    local_218._0_8_ = (long *)*plVar11;
  }
  local_218.m_data.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar11 + 1);
  *plVar11 = (long)plVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
  psVar13 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_238.field_2._M_allocated_capacity = *psVar13;
    local_238.field_2._8_8_ = plVar11[3];
    local_238._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar13;
    local_238._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_238._M_string_length = plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::operator=(local_1f0,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_218._0_8_ != (long)&local_218 + 0x10U) {
    operator_delete((void *)local_218._0_8_,local_218.m_data._8_8_ + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_1c8[0].name.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
  local_1c8[0].name._M_string_length = 7;
  local_1c8[0].name.field_2._M_allocated_capacity._4_4_ = 0x72656c;
  local_1c8[0].name._M_dataplus._M_p = (pointer)paVar2;
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.dim - IMG_DIM_1D < 4) {
    std::__cxx11::string::append((char *)local_1c8);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.imParams.isArrayed == true) {
    std::__cxx11::string::append((char *)local_1c8);
  }
  if ((this->super_TextureFilteringTestCase).m_testCaseData.samplerParams.isCompare == true) {
    std::__cxx11::string::append((char *)local_1c8);
  }
  std::__cxx11::string::_M_append((char *)local_1f0,(ulong)local_1c8[0].name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0].name._M_dataplus._M_p,
                    CONCAT44(local_1c8[0].name.field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_1c8[0].name.field_2._M_allocated_capacity) + 1);
  }
  std::__cxx11::string::append((char *)local_1f0);
  return;
}

Assistant:

Texture2DGradientTestCase (TestContext&			testCtx,
							   const char*			name,
							   const char*			desc,
							   TextureFormat		format,
							   IVec3				dimensions,
							   VkFilter				magFilter,
							   VkFilter				minFilter,
							   VkSamplerMipmapMode	mipmapFilter,
							   VkSamplerAddressMode	wrappingMode,
							   bool					useDerivatives)

		: TextureFilteringTestCase	(testCtx, name, desc)
		, m_format					(format)
		, m_dimensions				(dimensions)
		, m_magFilter				(magFilter)
		, m_minFilter				(minFilter)
		, m_mipmapFilter			(mipmapFilter)
		, m_wrappingMode			(wrappingMode)
		, m_useDerivatives			(useDerivatives)
	{
		m_testCaseData = genTestCaseData();
		initSpec();
	}